

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompositeATN.hpp
# Opt level: O0

CATNNode<unsigned_char> * __thiscall
Centaurus::CompositeATN<unsigned_char>::get_node
          (CompositeATN<unsigned_char> *this,Identifier *id,int index)

{
  mapped_type *this_00;
  CATNNode<unsigned_char> *pCVar1;
  int index_local;
  Identifier *id_local;
  CompositeATN<unsigned_char> *this_local;
  
  this_00 = std::
            unordered_map<Centaurus::Identifier,_Centaurus::CATNMachine<unsigned_char>,_std::hash<Centaurus::Identifier>,_std::equal_to<Centaurus::Identifier>,_std::allocator<std::pair<const_Centaurus::Identifier,_Centaurus::CATNMachine<unsigned_char>_>_>_>
            ::at(&this->m_dict,id);
  pCVar1 = CATNMachine<unsigned_char>::operator[](this_00,index);
  return pCVar1;
}

Assistant:

const CATNNode<TCHAR>& get_node(const Identifier& id, int index) const
    {
        return m_dict.at(id)[index];
    }